

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# makefile.h
# Opt level: O0

QString * __thiscall
MakefileGenerator::
escapeDependencyPath<QStringBuilder<QStringBuilder<QStringBuilder<ProString&,ProString>,ProString_const&>,char>,ProString>
          (MakefileGenerator *this,
          QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<ProString_&,_ProString>,_const_ProString_&>,_char>,_ProString>
          *path)

{
  long *in_RSI;
  QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<ProString_&,_ProString>,_const_ProString_&>,_char>,_ProString>
  *in_RDI;
  long in_FS_OFFSET;
  QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<ProString_&,_ProString>,_const_ProString_&>,_char>,_ProString>
  *pQVar1;
  undefined1 local_20 [24];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar1 = in_RDI;
  ::QStringBuilder::operator_cast_to_QString(in_RDI);
  (**(code **)(*in_RSI + 0x68))(in_RDI,in_RSI,local_20);
  QString::~QString((QString *)0x21d5f1);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return (QString *)pQVar1;
  }
  __stack_chk_fail();
}

Assistant:

QString escapeDependencyPath(const QStringBuilder<A, B> &path) const
    { return escapeDependencyPath(QString(path)); }